

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

HTTPResponse * get404Response(void)

{
  HTTPResponse *in_RDI;
  allocator<char> local_6b;
  allocator<char> local_6a;
  allocator<char> local_69;
  string local_68;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"Not Found",&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"text/html",&local_6a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Page Not Found",&local_6b)
  ;
  HTTPResponse::HTTPResponse(in_RDI,0x194,&local_28,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return in_RDI;
}

Assistant:

HTTPResponse get404Response()
{
    return HTTPResponse(404, "Not Found", "text/html", "Page Not Found");
}